

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

void oonf_layer2_net_relabel
               (oonf_layer2_net *l2net,oonf_layer2_origin *new_origin,oonf_layer2_origin *old_origin
               )

{
  list_entity *plVar1;
  list_entity *__tempptr_5;
  list_entity *__tempptr_4;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  size_t i;
  oonf_layer2_peer_address *peer_ip;
  oonf_layer2_neigh *l2neigh;
  oonf_layer2_origin *old_origin_local;
  oonf_layer2_origin *new_origin_local;
  oonf_layer2_net *l2net_local;
  
  for (__tempptr = (list_entity *)0x0; __tempptr < (list_entity *)0x10;
      __tempptr = (list_entity *)((long)&__tempptr->next + 1)) {
    if (l2net->data[(long)__tempptr]._origin == old_origin) {
      l2net->data[(long)__tempptr]._origin = new_origin;
    }
  }
  for (__tempptr = (list_entity *)0x0; __tempptr < (list_entity *)0x1a;
      __tempptr = (list_entity *)((long)&__tempptr->next + 1)) {
    if (l2net->neighdata[(long)__tempptr]._origin == old_origin) {
      l2net->neighdata[(long)__tempptr]._origin = new_origin;
    }
  }
  plVar1 = (l2net->local_peer_ips).list_head.next;
  while( true ) {
    if (plVar1->prev == (l2net->local_peer_ips).list_head.prev) break;
    if ((oonf_layer2_origin *)plVar1[-4].next == old_origin) {
      plVar1[-4].next = (list_entity *)new_origin;
    }
    plVar1 = plVar1->next;
  }
  plVar1 = (l2net->neighbors).list_head.next;
  while( true ) {
    peer_ip = (oonf_layer2_peer_address *)(plVar1 + -0x4c);
    if (plVar1->prev == (l2net->neighbors).list_head.prev) break;
    oonf_layer2_neigh_relabel((oonf_layer2_neigh *)peer_ip,new_origin,old_origin);
    plVar1 = plVar1->next;
  }
  return;
}

Assistant:

void
oonf_layer2_net_relabel(struct oonf_layer2_net *l2net, const struct oonf_layer2_origin *new_origin,
  const struct oonf_layer2_origin *old_origin) {
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_peer_address *peer_ip;
  size_t i;

  for (i = 0; i < OONF_LAYER2_NET_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2net->data[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2net->data[i], new_origin);
    }
  }

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (oonf_layer2_data_get_origin(&l2net->neighdata[i]) == old_origin) {
      oonf_layer2_data_set_origin(&l2net->neighdata[i], new_origin);
    }
  }

  avl_for_each_element(&l2net->local_peer_ips, peer_ip, _net_node) {
    if (peer_ip->origin == old_origin) {
      peer_ip->origin = new_origin;
    }
  }

  avl_for_each_element(&l2net->neighbors, l2neigh, _node) {
    oonf_layer2_neigh_relabel(l2neigh, new_origin, old_origin);
  }
}